

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_test.cc
# Opt level: O1

void __thiscall
IntegrationTest_TestMultipartUpload_inMemoryData_Test::TestBody
          (IntegrationTest_TestMultipartUpload_inMemoryData_Test *this)

{
  void *pvVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  Qiniu_ReaderAt reader;
  Qiniu_Error QVar5;
  Message local_3a0;
  Qiniu_ReadBuf rbuff;
  AssertHelper local_380;
  Qiniu_MultipartUpload_Result putRet;
  AssertionResult gtest_ar;
  Qiniu_Multipart_PutExtra putExtra;
  int local_2e8 [2];
  char *local_2e0;
  Qiniu_Client client_1;
  Qiniu_Mac mac;
  int local_228 [2];
  char *local_220;
  char memData [39];
  Qiniu_Client client;
  char inputKey [100];
  Qiniu_RS_StatRet statResult;
  
  memset(&client,0,0xa0);
  mac.accessKey = QINIU_ACCESS_KEY;
  mac.secretKey = QINIU_SECRET_KEY;
  Qiniu_Client_InitMacAuth(&client,0x400,&mac);
  Qiniu_Client_SetTimeout(&client,5000);
  Qiniu_Client_SetConnectTimeout(&client,3000);
  Qiniu_Client_EnableAutoQuery(&client,1);
  uVar2 = rand();
  snprintf(inputKey,100,"memoryDataKey_%d",(ulong)uVar2);
  Qiniu_RS_Delete(&client,Test_bucket,inputKey);
  pcVar3 = Test_bucket;
  builtin_strncpy(memData,"test multipart upload with memory data",0x27);
  memset(&client_1,0,0xa0);
  memset((Qiniu_RS_PutPolicy *)&statResult,0,0xa8);
  putRet.hash = (char *)0x0;
  putRet.key = (char *)0x0;
  putExtra.upHost = (char *)0x0;
  putExtra.partSize = 0;
  putExtra.mimeType = (char *)0x0;
  putExtra.tryTimes = 0;
  putExtra.enableContentMd5 = 0;
  putExtra.notify = (NotifyFunc)0x0;
  putExtra.notifyErr = (NotifyErrFunc)0x0;
  putExtra.xVarsList = (char *(*) [2])0x0;
  putExtra.xVarsCount = 0;
  putExtra._60_4_ = 0;
  putExtra.metaList = (char *(*) [2])0x0;
  putExtra.metaCount = 0;
  putExtra._76_4_ = 0;
  putExtra.recorder = (Qiniu_Recorder *)0x0;
  putExtra.upHosts = (char **)0x0;
  putExtra.upHostsCount = 0;
  putExtra.uploadingProgress = (_func_void_size_t_size_t *)0x0;
  statResult.hash = pcVar3;
  pcVar3 = Qiniu_RS_PutPolicy_Token((Qiniu_RS_PutPolicy *)&statResult,&mac);
  putExtra.mimeType = (char *)0x0;
  putExtra.partSize = 0x400000;
  putExtra.tryTimes = 2;
  putExtra.enableContentMd5 = 0;
  Qiniu_Client_InitMacAuth(&client_1,0x400,&mac);
  Qiniu_Client_SetTimeout(&client_1,5000);
  Qiniu_Client_SetConnectTimeout(&client_1,3000);
  Qiniu_Client_EnableAutoQuery(&client_1,1);
  reader = Qiniu_BufReaderAt(&rbuff,memData,0x27);
  QVar5 = Qiniu_Multipart_Put(&client_1,pcVar3,inputKey,reader,0x27,&putExtra,&putRet);
  local_220 = QVar5.message;
  local_228[0] = QVar5.code;
  local_3a0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 200;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"err.code","200",local_228,(int *)&local_3a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_3a0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/multipart_test.cc"
               ,0x2d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_380,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((long *)CONCAT44(local_3a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_3a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_3a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_3a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    if (*(void **)gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
        (void *)((long)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 0x10)) {
      operator_delete(*(void **)gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
    }
    operator_delete((void *)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl);
  }
  pcVar4 = Qiniu_Buffer_CStr(&client_1.respHeader);
  Qiniu_Stderr_Debug("%s",pcVar4);
  Qiniu_Stderr_Debug("hash: %s , key:%s",putRet.hash,putRet.key);
  Qiniu_Client_Cleanup(&client_1);
  Qiniu_Free(pcVar3);
  pcVar3 = putRet.key;
  QVar5 = Qiniu_RS_Stat(&client,&statResult,Test_bucket,putRet.key);
  local_2e0 = QVar5.message;
  local_2e8[0] = QVar5.code;
  putExtra.upHost = (char *)CONCAT44(putExtra.upHost._4_4_,200);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&client_1,"err.code","200",local_2e8,(int *)&putExtra);
  if ((char)client_1.curl == '\0') {
    testing::Message::Message((Message *)&putExtra);
    if (client_1.auth.self == (void *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *client_1.auth.self;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&rbuff,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/multipart_test.cc"
               ,0x101,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&rbuff,(Message *)&putExtra);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&rbuff);
    if (putExtra.upHost != (char *)0x0) {
      (**(code **)(*(long *)putExtra.upHost + 8))();
    }
  }
  pvVar1 = client_1.auth.self;
  if (client_1.auth.self != (void *)0x0) {
    if (*client_1.auth.self != (void *)((long)client_1.auth.self + 0x10)) {
      operator_delete(*client_1.auth.self);
    }
    operator_delete(pvVar1);
  }
  putExtra.upHost = &DAT_00000027;
  testing::internal::CmpHelperEQ<long_long,unsigned_long>
            ((internal *)&client_1,"statResult.fsize","sizeof(memData)",&statResult.fsize,
             (unsigned_long *)&putExtra);
  if ((char)client_1.curl == '\0') {
    testing::Message::Message((Message *)&putExtra);
    if (client_1.auth.self == (void *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *client_1.auth.self;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&rbuff,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/multipart_test.cc"
               ,0x102,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&rbuff,(Message *)&putExtra);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&rbuff);
    if (putExtra.upHost != (char *)0x0) {
      (**(code **)(*(long *)putExtra.upHost + 8))();
    }
  }
  pvVar1 = client_1.auth.self;
  if (client_1.auth.self != (void *)0x0) {
    if (*client_1.auth.self != (void *)((long)client_1.auth.self + 0x10)) {
      operator_delete(*client_1.auth.self);
    }
    operator_delete(pvVar1);
  }
  QVar5 = Qiniu_RS_Delete(&client,Test_bucket,pcVar3);
  local_2e0 = QVar5.message;
  local_2e8[0] = QVar5.code;
  putExtra.upHost = (char *)CONCAT44(putExtra.upHost._4_4_,200);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&client_1,"err.code","200",local_2e8,(int *)&putExtra);
  if ((char)client_1.curl == '\0') {
    testing::Message::Message((Message *)&putExtra);
    if (client_1.auth.self == (void *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *client_1.auth.self;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&rbuff,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/multipart_test.cc"
               ,0x106,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&rbuff,(Message *)&putExtra);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&rbuff);
    if (putExtra.upHost != (char *)0x0) {
      (**(code **)(*(long *)putExtra.upHost + 8))();
    }
  }
  if (client_1.auth.self != (void *)0x0) {
    if (*client_1.auth.self != (void *)((long)client_1.auth.self + 0x10)) {
      operator_delete(*client_1.auth.self);
    }
    operator_delete(client_1.auth.self);
  }
  Qiniu_Client_Cleanup(&client);
  return;
}

Assistant:

TEST(IntegrationTest, TestMultipartUpload_inMemoryData)
{
	Qiniu_Client client;
	Qiniu_Zero(client);

	Qiniu_Error err;
	Qiniu_Mac mac = {QINIU_ACCESS_KEY, QINIU_SECRET_KEY};
	Qiniu_Client_InitMacAuth(&client, 1024, &mac);
	Qiniu_Client_SetTimeout(&client, 5000);
	Qiniu_Client_SetConnectTimeout(&client, 3000);
	Qiniu_Client_EnableAutoQuery(&client, Qiniu_True);

	char inputKey[100];
	Qiniu_snprintf(inputKey, 100, "memoryDataKey_%d", rand());

	// step1: delete  file if exist
	Qiniu_RS_Delete(&client, Test_bucket, inputKey);

	// step2: upload memory data
	const char memData[] = "test multipart upload with memory data";
	const char *returnKey = putMemoryData_multipart(Test_bucket, inputKey, NULL, memData, sizeof(memData), &mac);

	// step3: stat file
	Qiniu_RS_StatRet statResult;
	err = Qiniu_RS_Stat(&client, &statResult, Test_bucket, returnKey);
	EXPECT_EQ(err.code, 200);
	EXPECT_EQ(statResult.fsize, sizeof(memData));

	// step4: delete file
	err = Qiniu_RS_Delete(&client, Test_bucket, returnKey);
	EXPECT_EQ(err.code, 200);

	Qiniu_Client_Cleanup(&client);
}